

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall
cli::Parser::set_optional<unsigned_long>
          (Parser *this,string *name,string *alternative,unsigned_long defaultValue,
          string *description)

{
  CmdArgument<unsigned_long> *this_00;
  CmdArgument<unsigned_long> *local_38;
  
  this_00 = (CmdArgument<unsigned_long> *)operator_new(0xb0);
  CmdArgument<unsigned_long>::CmdArgument(this_00,name,alternative,description,false);
  this_00->value = defaultValue;
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>>::
  emplace_back<cli::Parser::CmdBase*>
            ((vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>> *)&this->_commands
             ,(CmdBase **)&local_38);
  return;
}

Assistant:

void set_optional(const std::string& name, const std::string& alternative, T defaultValue, const std::string& description = "") {
			auto command = new CmdArgument<T> { name, alternative, description, false };
			command->value = defaultValue;
			_commands.push_back(command);
		}